

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

int64_t __thiscall libtorrent::bdecode_node::int_value(bdecode_node *this)

{
  char cVar1;
  char *pcVar2;
  int64_t iVar3;
  long lVar4;
  ulong uVar5;
  error_code_enum ec;
  int64_t val;
  
  pcVar2 = this->m_buffer;
  uVar5 = (ulong)this->m_root_tokens[this->m_token_idx] & 0x1fffffff;
  val = 0;
  cVar1 = pcVar2[uVar5 + 1];
  ec = no_error;
  parse_int(pcVar2 + (cVar1 == '-') + uVar5 + 1,
            pcVar2 + ((ulong)this->m_root_tokens[(long)this->m_token_idx + 1] & 0x1fffffff) + 1,'e',
            &val,&ec);
  lVar4 = -val;
  if (cVar1 != '-') {
    lVar4 = val;
  }
  iVar3 = 0;
  if (ec == no_error) {
    iVar3 = lVar4;
  }
  return iVar3;
}

Assistant:

std::int64_t bdecode_node::int_value() const
	{
		TORRENT_ASSERT(type() == int_t);
		bdecode_token const& t = m_root_tokens[m_token_idx];
		int const size = token_source_span(t);
		TORRENT_ASSERT(t.type == bdecode_token::integer);

		// +1 is to skip the 'i'
		char const* ptr = m_buffer + t.offset + 1;
		std::int64_t val = 0;
		bool const negative = (*ptr == '-');
		bdecode_errors::error_code_enum ec = bdecode_errors::no_error;
		char const* end = parse_int(ptr + int(negative)
			, ptr + size, 'e', val, ec);
		if (ec) return 0;
		TORRENT_UNUSED(end);
		TORRENT_ASSERT(end < ptr + size);
		if (negative) val = -val;
		return val;
	}